

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall mjs::object_literal_expression::print(object_literal_expression *this,wostream *os)

{
  property_assignment_type t;
  long *plVar1;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar2;
  wostream *pwVar3;
  pointer ppVar4;
  long lVar5;
  size_t i;
  ulong uVar6;
  
  std::operator<<(os,"object_literal_expression{");
  lVar5 = 0;
  for (uVar6 = 0;
      ppVar4 = (this->elements_).
               super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)(((long)(this->elements_).
                             super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4) / 0x18);
      uVar6 = uVar6 + 1) {
    if (uVar6 != 0) {
      std::operator<<(os,", ");
      ppVar4 = (this->elements_).
               super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    t = *(property_assignment_type *)((long)&ppVar4->type_ + lVar5);
    if (t != normal) {
      pbVar2 = mjs::operator<<(os,t);
      std::operator<<(pbVar2," ");
      ppVar4 = (this->elements_).
               super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    plVar1 = *(long **)((long)&(ppVar4->name_)._M_t.
                               super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                       + lVar5);
    (**(code **)(*plVar1 + 0x10))(plVar1,os);
    pwVar3 = std::operator<<(os,": ");
    plVar1 = *(long **)((long)&(((this->elements_).
                                 super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->value_)._M_t.
                               super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                       + lVar5);
    (**(code **)(*plVar1 + 0x10))(plVar1,pwVar3);
    lVar5 = lVar5 + 0x18;
  }
  std::operator<<(os,"}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "object_literal_expression{";
        for (size_t i = 0; i < elements_.size(); ++i) {
            if (i) os << ", ";
            if (elements_[i].type() != property_assignment_type::normal) os << elements_[i].type() << " ";
            os << elements_[i].name() << ": " << elements_[i].value();
        }
        os << "}";
    }